

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O1

void clear_line(void)

{
  char c;
  size_t sVar1;
  int iVar2;
  int k;
  int iVar3;
  long lVar4;
  
  iVar2 = (prompt_len + rl_point) / tty_cols;
  sVar1 = strlen(rl_prompt);
  rl_point = -(int)sVar1;
  if (0 < iVar2) {
    iVar3 = 0;
    do {
      c = '\x1b';
      lVar4 = 1;
      do {
        tty_put(c);
        c = "\x1b[A"[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != iVar2);
  }
  tty_put('\r');
  ceol();
  rl_point = 0;
  rl_end = 0;
  *rl_line_buffer = '\0';
  return;
}

Assistant:

static void clear_line(void)
{
    int n = (rl_point + prompt_len) / tty_cols;
    rl_point = -(int)strlen(rl_prompt);

    if (n > 0) {
        for(int k = 0; k < n; k++)
            tty_puts(line_up);
        tty_put('\r');
    }
    else {
        tty_put('\r');
    }

    ceol();

    rl_point = 0;
    rl_end = 0;
    rl_line_buffer[0] = '\0';
}